

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamCleaner.cpp
# Opt level: O2

void clipCoverage(string *filename,string *outfile)

{
  char cVar1;
  __type _Var2;
  vector *pvVar3;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *pvVar4;
  const_reference pvVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  BamReader bamreader;
  BamWriter writer;
  string mateReferenceID;
  string referenceID;
  BamAlignment alignment;
  int local_d8;
  int local_b0;
  
  BamTools::BamReader::BamReader(&bamreader);
  cVar1 = BamTools::BamReader::Open((string *)&bamreader);
  if (cVar1 == '\0') {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&alignment);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&alignment);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"Couldn\'t open Bamfile");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BamTools::BamAlignment::BamAlignment(&alignment);
  BamTools::BamWriter::BamWriter(&writer);
  pvVar3 = (vector *)BamTools::BamReader::GetConstSamHeader();
  BamTools::BamReader::GetReferenceData();
  cVar1 = BamTools::BamWriter::Open((string *)&writer,(SamHeader *)outfile,pvVar3);
  if (cVar1 != '\0') {
    while( true ) {
      cVar1 = BamTools::BamReader::GetNextAlignment((BamAlignment *)&bamreader);
      if (cVar1 == '\0') break;
      pvVar4 = (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               BamTools::BamReader::GetReferenceData();
      pvVar5 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                         (pvVar4,(long)local_d8);
      std::__cxx11::string::string((string *)&referenceID,(string *)pvVar5);
      pvVar4 = (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
               BamTools::BamReader::GetReferenceData();
      pvVar5 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                         (pvVar4,(long)local_b0);
      std::__cxx11::string::string((string *)&mateReferenceID,(string *)pvVar5);
      cVar1 = BamTools::BamAlignment::IsProperPair();
      if (cVar1 != '\0') {
        cVar1 = BamTools::BamAlignment::IsDuplicate();
        if (cVar1 == '\0') {
          _Var2 = std::operator==(&referenceID,&mateReferenceID);
          if (_Var2) {
            cVar1 = BamTools::BamAlignment::IsFailedQC();
            if (cVar1 == '\0') {
              cVar1 = BamTools::BamAlignment::IsMapped();
              if (cVar1 != '\0') {
                cVar1 = BamTools::BamAlignment::IsMateMapped();
                if (cVar1 != '\0') {
                  BamTools::BamWriter::SaveAlignment((BamAlignment *)&writer);
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&mateReferenceID);
      std::__cxx11::string::~string((string *)&referenceID);
    }
    BamTools::BamWriter::Close();
    BamTools::BamWriter::~BamWriter(&writer);
    BamTools::BamAlignment::~BamAlignment(&alignment);
    BamTools::BamReader::~BamReader(&bamreader);
    return;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Couldn\'t open out Bamfile");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void clipCoverage(string filename, string outfile) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;

    BamTools::BamWriter writer;
    if (not writer.Open(outfile,bamreader.GetConstSamHeader(),bamreader.GetReferenceData())) {
            throw std::runtime_error("Couldn't open out Bamfile");
    }
    while (bamreader.GetNextAlignment(alignment)){
        string referenceID= bamreader.GetReferenceData().at(alignment.RefID).RefName;
        string mateReferenceID= bamreader.GetReferenceData().at(alignment.MateRefID).RefName;
        if (!alignment.IsProperPair() || alignment.IsDuplicate() || !(referenceID==mateReferenceID) || alignment.IsFailedQC() || !(alignment.IsMapped()&&alignment.IsMateMapped())) {
            continue;
        }
        writer.SaveAlignment(alignment);
    }
    writer.Close();
}